

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeGetErrWeights(void *arkode_mem,N_Vector eweight)

{
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x8b9,"ARKodeGetErrWeights",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_RDI->step_supports_implicit == 0) && (in_RDI->step_supports_adaptive == 0)) {
    arkProcessError(in_RDI,-0x30,0x8c3,"ARKodeGetErrWeights",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not use tolerances");
    local_4 = -0x30;
  }
  else {
    N_VScale(0x3ff0000000000000,in_RDI->ewt,in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeGetErrWeights(void* arkode_mem, N_Vector eweight)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not use tolerances
     (i.e., neither supports adaptivity nor needs an algebraic solver) */
  if ((!ark_mem->step_supports_implicit) && (!ark_mem->step_supports_adaptive))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not use tolerances");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  N_VScale(ONE, ark_mem->ewt, eweight);
  return (ARK_SUCCESS);
}